

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O2

MDDEntry * __thiscall ASDCP::Dictionary::FindULExact(Dictionary *this,byte_t *ul_buf)

{
  const_iterator cVar1;
  ILogSink *this_00;
  char *pcVar2;
  MDDEntry *pMVar3;
  char buf [64];
  UL local_38;
  
  if (*this->m_MDD_Table[0].name != '\0') {
    buf[8] = '\x01';
    buf._9_8_ = *(undefined8 *)ul_buf;
    buf._17_8_ = *(undefined8 *)(ul_buf + 8);
    buf._0_8_ = &PTR__IArchive_002112c8;
    cVar1 = std::
            _Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_unsigned_int>,_std::_Select1st<std::pair<const_ASDCP::UL,_unsigned_int>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
            ::find((_Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_unsigned_int>,_std::_Select1st<std::pair<const_ASDCP::UL,_unsigned_int>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
                    *)this,(key_type *)buf);
    if ((_Rb_tree_header *)cVar1._M_node == &(this->m_md_lookup)._M_t._M_impl.super__Rb_tree_header)
    {
      local_38.super_Identifier<16U>.m_HasValue = true;
      local_38.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)ul_buf;
      local_38.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(ul_buf + 8);
      local_38.super_Identifier<16U>.super_IArchive._vptr_IArchive =
           (_func_int **)&PTR__IArchive_002112c8;
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      pcVar2 = UL::EncodeString(&local_38,buf,0x40);
      pMVar3 = (MDDEntry *)0x0;
      Kumu::ILogSink::Warn(this_00,"UL Dictionary: unknown UL: %s\n",pcVar2);
    }
    else {
      pMVar3 = this->m_MDD_Table + cVar1._M_node[2]._M_color;
    }
    return pMVar3;
  }
  __assert_fail("m_MDD_Table[0].name[0]",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Dict.cpp"
                ,0x15c,"const ASDCP::MDDEntry *ASDCP::Dictionary::FindULExact(const byte_t *) const"
               );
}

Assistant:

const ASDCP::MDDEntry*
ASDCP::Dictionary::FindULExact(const byte_t* ul_buf) const
{
  assert(m_MDD_Table[0].name[0]);
  std::map<UL, ui32_t>::const_iterator i = m_md_lookup.find(UL(ul_buf));
  
  if ( i == m_md_lookup.end() )
    {
      char buf[64];
      UL tmp_ul(ul_buf);
      Kumu::DefaultLogSink().Warn("UL Dictionary: unknown UL: %s\n", tmp_ul.EncodeString(buf, 64));
      return 0;
    }

  return &m_MDD_Table[i->second];
}